

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateArraySetup(ExpressionEvalContext *ctx,ExprArraySetup *expression)

{
  TypeBase *pTVar1;
  _func_int **pp_Var2;
  Allocator *pAVar3;
  SynBase *pSVar4;
  bool bVar5;
  int iVar6;
  ExprBase *pEVar7;
  ExprBase *pEVar8;
  undefined4 extraout_var;
  TypeRef *type;
  undefined4 extraout_var_00;
  ulong uVar9;
  _func_int **ptr;
  
  bVar5 = AddInstruction(ctx);
  if (bVar5) {
    pTVar1 = expression->lhs->type;
    if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x70f,"ExprBase *EvaluateArraySetup(ExpressionEvalContext &, ExprArraySetup *)"
                   );
    }
    pp_Var2 = pTVar1[1]._vptr_TypeBase;
    if ((pp_Var2 == (_func_int **)0x0) || (*(int *)(pp_Var2 + 1) != 0x13)) {
      __assert_fail("arrayType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x713,"ExprBase *EvaluateArraySetup(ExpressionEvalContext &, ExprArraySetup *)"
                   );
    }
    pEVar7 = Evaluate(ctx,expression->initializer);
    if (((pEVar7 != (ExprBase *)0x0) &&
        (pEVar8 = Evaluate(ctx,expression->lhs), pEVar8 != (ExprBase *)0x0)) &&
       (pEVar8->typeID == 0xc)) {
      uVar9 = 0;
      do {
        if (*(uint *)(pp_Var2 + 0xd) <= uVar9) {
          pAVar3 = ctx->ctx->allocator;
          iVar6 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
          pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar6);
          pSVar4 = (expression->super_ExprBase).source;
          pTVar1 = ctx->ctx->typeVoid;
          pEVar7->typeID = 2;
          pEVar7->source = pSVar4;
          pEVar7->type = pTVar1;
          pEVar7->next = (ExprBase *)0x0;
          pEVar7->listed = false;
          pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223678;
          pEVar7 = CheckType(&expression->super_ExprBase,pEVar7);
          return pEVar7;
        }
        bVar5 = AddInstruction(ctx);
        if (!bVar5) {
          return (ExprBase *)0x0;
        }
        ptr = (_func_int **)
              (*(long *)(pp_Var2[0xc] + 0x30) * uVar9 + (long)pEVar8[1]._vptr_ExprBase);
        if (*(ulong *)&pEVar8[1].typeID < (ulong)((long)ptr + *(long *)(pp_Var2[0xc] + 0x30))) {
          __assert_fail("ptr->ptr + i * arrayType->subType->size + arrayType->subType->size <= ptr->end"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x725,
                        "ExprBase *EvaluateArraySetup(ExpressionEvalContext &, ExprArraySetup *)");
        }
        pAVar3 = ctx->ctx->allocator;
        iVar6 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x40);
        pSVar4 = (expression->super_ExprBase).source;
        type = ExpressionContext::GetReferenceType(ctx->ctx,(TypeBase *)pp_Var2[0xc]);
        ExprPointerLiteral::ExprPointerLiteral
                  ((ExprPointerLiteral *)CONCAT44(extraout_var,iVar6),pSVar4,&type->super_TypeBase,
                   (uchar *)ptr,(uchar *)((long)ptr + *(long *)(pp_Var2[0xc] + 0x30)));
        bVar5 = CreateStore(ctx,(ExprBase *)CONCAT44(extraout_var,iVar6),pEVar7);
        uVar9 = uVar9 + 1;
      } while (bVar5);
    }
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateArraySetup(ExpressionEvalContext &ctx, ExprArraySetup *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	TypeRef *refType = getType<TypeRef>(expression->lhs->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	ExprBase *initializer = Evaluate(ctx, expression->initializer);

	if(!initializer)
		return NULL;

	ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(Evaluate(ctx, expression->lhs));

	if(!ptr)
		return NULL;

	for(unsigned i = 0; i < unsigned(arrayType->length); i++)
	{
		if(!AddInstruction(ctx))
			return NULL;

		assert(ptr);
		assert(ptr->ptr + i * arrayType->subType->size + arrayType->subType->size <= ptr->end);

		unsigned char *targetPtr = ptr->ptr + i * arrayType->subType->size;

		ExprPointerLiteral *shifted = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

		if(!CreateStore(ctx, shifted, initializer))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}